

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bicgstab.h
# Opt level: O0

int BiCGSTAB<TPZMatrix<long_double>,TPZFMatrix<long_double>,TPZMatrixSolver<long_double>,double>
              (TPZMatrix<long_double> *A,TPZFMatrix<long_double> *x,TPZFMatrix<long_double> *b,
              TPZMatrixSolver<long_double> *M,int64_t *max_iter,double *tol,
              TPZFMatrix<long_double> *residual,int FromCurrent)

{
  longdouble lVar1;
  longdouble lVar2;
  longdouble *plVar3;
  long *in_RCX;
  undefined8 in_RDX;
  long *in_RSI;
  long *in_RDI;
  long *in_R8;
  double *in_R9;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble lVar4;
  longdouble lVar5;
  longdouble lVar6;
  longdouble in_ST6;
  longdouble in_ST7;
  REAL RVar7;
  undefined1 *in_stack_00000008;
  int in_stack_00000010;
  int64_t i;
  TPZFMatrix<long_double> rtilde;
  double normb;
  TPZFMatrix<long_double> *r;
  TPZFMatrix<long_double> *res;
  TPZFMatrix<long_double> resbackup;
  TPZFMatrix<long_double> v;
  TPZFMatrix<long_double> t;
  TPZFMatrix<long_double> shat;
  TPZFMatrix<long_double> s;
  TPZFMatrix<long_double> phat;
  TPZFMatrix<long_double> p;
  TPZFMatrix<long_double> omega;
  TPZFMatrix<long_double> beta;
  TPZFMatrix<long_double> alpha;
  TPZFMatrix<long_double> rho_2;
  TPZFMatrix<long_double> rho_1;
  double resid;
  TPZFMatrix<long_double> *pTVar8;
  TPZFMatrix<long_double> *pTVar9;
  undefined2 in_stack_fffffffffffff020;
  undefined2 uVar10;
  undefined6 in_stack_fffffffffffff022;
  TPZFMatrix<long_double> *in_stack_fffffffffffff028;
  undefined2 in_stack_fffffffffffff030;
  undefined6 in_stack_fffffffffffff032;
  undefined2 in_stack_fffffffffffff038;
  undefined6 in_stack_fffffffffffff03a;
  TPZFMatrix<long_double> *in_stack_fffffffffffff050;
  TPZFMatrix<long_double> *in_stack_fffffffffffff058;
  undefined2 in_stack_fffffffffffff060;
  undefined2 uVar11;
  undefined2 in_stack_fffffffffffff062;
  undefined4 in_stack_fffffffffffff064;
  undefined6 in_stack_fffffffffffff068;
  undefined2 in_stack_fffffffffffff06e;
  longdouble in_stack_fffffffffffff070;
  undefined4 local_f84;
  undefined6 in_stack_fffffffffffff080;
  undefined2 in_stack_fffffffffffff086;
  TPZFMatrix<long_double> *this;
  longdouble in_stack_fffffffffffff088;
  long local_7c8;
  double local_728;
  undefined1 *local_718;
  undefined1 local_710 [144];
  undefined1 local_680 [144];
  undefined1 local_5f0 [144];
  undefined1 local_560 [144];
  undefined1 local_4d0 [144];
  undefined1 local_440 [144];
  undefined1 local_3b0 [144];
  TPZFMatrix<long_double> local_320;
  TPZFMatrix<long_double> local_290;
  TPZFMatrix<long_double> local_200;
  TPZFMatrix<long_double> local_160;
  TPZFMatrix<long_double> local_d0;
  double local_40;
  double *local_38;
  long *local_30;
  long *local_28;
  undefined8 local_20;
  long *local_18;
  long *local_10;
  int local_4;
  
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  TPZFMatrix<long_double>::TPZFMatrix
            ((TPZFMatrix<long_double> *)
             CONCAT44(in_stack_fffffffffffff064,
                      CONCAT22(in_stack_fffffffffffff062,in_stack_fffffffffffff060)),
             (int64_t)in_stack_fffffffffffff058,(int64_t)in_stack_fffffffffffff050);
  TPZFMatrix<long_double>::TPZFMatrix
            ((TPZFMatrix<long_double> *)
             CONCAT44(in_stack_fffffffffffff064,
                      CONCAT22(in_stack_fffffffffffff062,in_stack_fffffffffffff060)),
             (int64_t)in_stack_fffffffffffff058,(int64_t)in_stack_fffffffffffff050);
  TPZFMatrix<long_double>::TPZFMatrix
            ((TPZFMatrix<long_double> *)
             CONCAT44(in_stack_fffffffffffff064,
                      CONCAT22(in_stack_fffffffffffff062,in_stack_fffffffffffff060)),
             (int64_t)in_stack_fffffffffffff058,(int64_t)in_stack_fffffffffffff050);
  TPZFMatrix<long_double>::TPZFMatrix
            ((TPZFMatrix<long_double> *)
             CONCAT44(in_stack_fffffffffffff064,
                      CONCAT22(in_stack_fffffffffffff062,in_stack_fffffffffffff060)),
             (int64_t)in_stack_fffffffffffff058,(int64_t)in_stack_fffffffffffff050);
  TPZFMatrix<long_double>::TPZFMatrix
            ((TPZFMatrix<long_double> *)
             CONCAT44(in_stack_fffffffffffff064,
                      CONCAT22(in_stack_fffffffffffff062,in_stack_fffffffffffff060)),
             (int64_t)in_stack_fffffffffffff058,(int64_t)in_stack_fffffffffffff050);
  TPZFMatrix<long_double>::TPZFMatrix(in_stack_fffffffffffff050);
  TPZFMatrix<long_double>::TPZFMatrix(in_stack_fffffffffffff050);
  TPZFMatrix<long_double>::TPZFMatrix(in_stack_fffffffffffff050);
  TPZFMatrix<long_double>::TPZFMatrix(in_stack_fffffffffffff050);
  TPZFMatrix<long_double>::TPZFMatrix(in_stack_fffffffffffff050);
  TPZFMatrix<long_double>::TPZFMatrix(in_stack_fffffffffffff050);
  TPZFMatrix<long_double>::TPZFMatrix(in_stack_fffffffffffff050);
  local_718 = in_stack_00000008;
  if (in_stack_00000008 == (undefined1 *)0x0) {
    local_718 = local_710;
  }
  Norm((TPZFMatrix<long_double> *)CONCAT62(in_stack_fffffffffffff022,in_stack_fffffffffffff020));
  uVar10 = (undefined2)((unkuint10)in_ST0 >> 0x40);
  lVar4 = in_ST7;
  local_728 = TPZExtractVal::val(in_ST0);
  if (in_stack_00000010 == 0) {
    (**(code **)(*local_18 + 0x78))();
    TPZFMatrix<long_double>::operator=
              ((TPZFMatrix<long_double> *)
               CONCAT62(in_stack_fffffffffffff03a,in_stack_fffffffffffff038),
               (TPZFMatrix<long_double> *)
               CONCAT62(in_stack_fffffffffffff032,in_stack_fffffffffffff030));
  }
  else {
    lVar4 = (longdouble)1;
    in_stack_fffffffffffff028 = SUB108(lVar4,0);
    in_stack_fffffffffffff030 = (undefined2)((unkuint10)lVar4 >> 0x40);
    uVar10 = (undefined2)((unkuint10)-lVar4 >> 0x40);
    in_ST7 = in_ST6;
    lVar4 = in_ST6;
    (**(code **)(*local_10 + 0x138))(local_10,local_18,local_20,local_718,0);
  }
  TPZFMatrix<long_double>::TPZFMatrix
            (SUB108(in_stack_fffffffffffff070,0),
             (TPZFMatrix<long_double> *)
             CONCAT26(in_stack_fffffffffffff06e,in_stack_fffffffffffff068));
  if ((local_728 == 0.0) && (!NAN(local_728))) {
    local_728 = 1.0;
  }
  Norm((TPZFMatrix<long_double> *)CONCAT62(in_stack_fffffffffffff022,uVar10));
  lVar5 = lVar4;
  local_40 = TPZExtractVal::val(in_ST1);
  if (*local_38 <= local_40 / local_728) {
    for (local_7c8 = 1; pTVar9 = SUB108(in_stack_fffffffffffff070,0),
        this = SUB108(in_stack_fffffffffffff088,0), local_7c8 <= *local_30;
        local_7c8 = local_7c8 + 1) {
      Dot<long_double>(in_stack_fffffffffffff058,in_stack_fffffffffffff050);
      plVar3 = TPZFMatrix<long_double>::operator()(&local_d0,0);
      *plVar3 = in_ST2;
      plVar3 = TPZFMatrix<long_double>::operator()(&local_d0,0);
      uVar10 = (undefined2)((unkuint10)*plVar3 >> 0x40);
      RVar7 = TPZExtractVal::val(*plVar3);
      if ((RVar7 == 0.0) && (!NAN(RVar7))) {
        Norm((TPZFMatrix<long_double> *)CONCAT62(in_stack_fffffffffffff022,uVar10));
        RVar7 = TPZExtractVal::val(in_ST3);
        *local_38 = RVar7 / local_728;
        local_4 = 2;
        goto LAB_012cf03e;
      }
      if (local_7c8 == 1) {
        TPZFMatrix<long_double>::operator=
                  ((TPZFMatrix<long_double> *)
                   CONCAT62(in_stack_fffffffffffff03a,in_stack_fffffffffffff038),
                   (TPZFMatrix<long_double> *)
                   CONCAT62(in_stack_fffffffffffff032,in_stack_fffffffffffff030));
        in_ST2 = lVar4;
      }
      else {
        plVar3 = TPZFMatrix<long_double>::operator()(&local_d0,0);
        lVar4 = *plVar3;
        plVar3 = TPZFMatrix<long_double>::operator()(&local_160,0);
        lVar6 = *plVar3;
        plVar3 = TPZFMatrix<long_double>::operator()(&local_200,0);
        lVar1 = *plVar3;
        plVar3 = TPZFMatrix<long_double>::operator()(&local_320,0);
        lVar2 = *plVar3;
        in_ST2 = in_ST7;
        lVar5 = in_ST7;
        plVar3 = TPZFMatrix<long_double>::operator()(&local_290,0);
        *plVar3 = (lVar4 / lVar6) * (lVar1 / lVar2);
        plVar3 = TPZFMatrix<long_double>::operator()(&local_290,0);
        lVar4 = *plVar3;
        TPZFMatrix<long_double>::operator()(&local_320,0);
        operator*((longdouble)
                  CONCAT28(in_stack_fffffffffffff038,
                           CONCAT62(in_stack_fffffffffffff032,in_stack_fffffffffffff030)),
                  in_stack_fffffffffffff028);
        TPZFMatrix<long_double>::operator-
                  (this,(TPZFMatrix<long_double> *)
                        CONCAT26(in_stack_fffffffffffff086,in_stack_fffffffffffff080));
        pTVar8 = SUB108(lVar4,0);
        uVar10 = (undefined2)((unkuint10)lVar4 >> 0x40);
        operator*((longdouble)
                  CONCAT28(in_stack_fffffffffffff038,
                           CONCAT62(in_stack_fffffffffffff032,in_stack_fffffffffffff030)),
                  in_stack_fffffffffffff028);
        TPZFMatrix<long_double>::operator+
                  (this,(TPZFMatrix<long_double> *)
                        CONCAT26(in_stack_fffffffffffff086,in_stack_fffffffffffff080));
        TPZFMatrix<long_double>::operator=
                  ((TPZFMatrix<long_double> *)CONCAT62(in_stack_fffffffffffff022,uVar10),pTVar8);
        TPZFMatrix<long_double>::~TPZFMatrix((TPZFMatrix<long_double> *)0x12ce8e8);
        TPZFMatrix<long_double>::~TPZFMatrix((TPZFMatrix<long_double> *)0x12ce8f5);
        TPZFMatrix<long_double>::~TPZFMatrix((TPZFMatrix<long_double> *)0x12ce902);
        TPZFMatrix<long_double>::~TPZFMatrix((TPZFMatrix<long_double> *)0x12ce90f);
      }
      (**(code **)(*local_28 + 0x58))(local_28,local_3b0,local_440,0);
      (**(code **)(*local_10 + 0x128))(local_10,local_440,local_680,0);
      plVar3 = TPZFMatrix<long_double>::operator()(&local_d0,0);
      lVar4 = *plVar3;
      Dot<long_double>(in_stack_fffffffffffff058,in_stack_fffffffffffff050);
      lVar6 = lVar5;
      plVar3 = TPZFMatrix<long_double>::operator()(&local_200,0);
      *plVar3 = lVar4 / in_ST3;
      plVar3 = TPZFMatrix<long_double>::operator()(&local_200,0);
      pTVar8 = SUB108(*plVar3,0);
      uVar10 = (undefined2)((unkuint10)*plVar3 >> 0x40);
      lVar4 = lVar6;
      operator*((longdouble)
                CONCAT28(in_stack_fffffffffffff038,
                         CONCAT62(in_stack_fffffffffffff032,in_stack_fffffffffffff030)),
                in_stack_fffffffffffff028);
      TPZFMatrix<long_double>::operator-
                (this,(TPZFMatrix<long_double> *)
                      CONCAT26(in_stack_fffffffffffff086,in_stack_fffffffffffff080));
      TPZFMatrix<long_double>::operator=
                ((TPZFMatrix<long_double> *)CONCAT62(in_stack_fffffffffffff022,uVar10),pTVar8);
      TPZFMatrix<long_double>::~TPZFMatrix((TPZFMatrix<long_double> *)0x12ceae9);
      TPZFMatrix<long_double>::~TPZFMatrix((TPZFMatrix<long_double> *)0x12ceaf6);
      in_ST3 = lVar5;
      Norm((TPZFMatrix<long_double> *)CONCAT62(in_stack_fffffffffffff022,uVar10));
      lVar5 = lVar4;
      local_40 = TPZExtractVal::val(in_ST4);
      if (local_40 / local_728 < *local_38) {
        TPZFMatrix<long_double>::operator()(&local_200,0);
        operator*((longdouble)
                  CONCAT28(in_stack_fffffffffffff038,
                           CONCAT62(in_stack_fffffffffffff032,in_stack_fffffffffffff030)),
                  in_stack_fffffffffffff028);
        TPZFMatrix<long_double>::operator+=
                  (pTVar9,(TPZMatrix<long_double> *)
                          CONCAT26(in_stack_fffffffffffff06e,in_stack_fffffffffffff068));
        TPZFMatrix<long_double>::~TPZFMatrix((TPZFMatrix<long_double> *)0x12ceb95);
        *local_38 = local_40;
        local_4 = 0;
        goto LAB_012cf03e;
      }
      (**(code **)(*local_28 + 0x58))(local_28,local_4d0,local_560,0);
      in_stack_fffffffffffff088 = in_ST4;
      (**(code **)(*local_10 + 0x128))(local_10,local_560,local_5f0,0);
      in_ST4 = lVar6;
      Dot<long_double>(in_stack_fffffffffffff058,in_stack_fffffffffffff050);
      local_f84 = SUB104(in_ST5,0);
      in_stack_fffffffffffff080 = (undefined6)((unkuint10)in_ST5 >> 0x20);
      in_ST5 = lVar4;
      Dot<long_double>(in_stack_fffffffffffff058,in_stack_fffffffffffff050);
      lVar6 = lVar5;
      TPZFMatrix<long_double>::operator=
                (&local_320,(longdouble)CONCAT64(in_stack_fffffffffffff080,local_f84) / in_ST6);
      TPZFMatrix<long_double>::operator()(&local_200,0);
      operator*((longdouble)
                CONCAT28(in_stack_fffffffffffff038,
                         CONCAT62(in_stack_fffffffffffff032,in_stack_fffffffffffff030)),
                in_stack_fffffffffffff028);
      TPZFMatrix<long_double>::operator()(&local_320,0);
      operator*((longdouble)
                CONCAT28(in_stack_fffffffffffff038,
                         CONCAT62(in_stack_fffffffffffff032,in_stack_fffffffffffff030)),
                in_stack_fffffffffffff028);
      TPZFMatrix<long_double>::operator+
                (SUB108(in_stack_fffffffffffff088,0),
                 (TPZFMatrix<long_double> *)
                 CONCAT26(in_stack_fffffffffffff086,in_stack_fffffffffffff080));
      TPZFMatrix<long_double>::operator+=
                (SUB108(in_ST6,0),
                 (TPZMatrix<long_double> *)
                 CONCAT26(in_stack_fffffffffffff06e,in_stack_fffffffffffff068));
      TPZFMatrix<long_double>::~TPZFMatrix((TPZFMatrix<long_double> *)0x12ced71);
      TPZFMatrix<long_double>::~TPZFMatrix((TPZFMatrix<long_double> *)0x12ced7e);
      TPZFMatrix<long_double>::~TPZFMatrix((TPZFMatrix<long_double> *)0x12ced8b);
      plVar3 = TPZFMatrix<long_double>::operator()(&local_320,0);
      pTVar9 = SUB108(*plVar3,0);
      uVar10 = (undefined2)((unkuint10)*plVar3 >> 0x40);
      operator*((longdouble)
                CONCAT28(in_stack_fffffffffffff038,
                         CONCAT62(in_stack_fffffffffffff032,in_stack_fffffffffffff030)),
                in_stack_fffffffffffff028);
      TPZFMatrix<long_double>::operator-
                (SUB108(in_stack_fffffffffffff088,0),
                 (TPZFMatrix<long_double> *)
                 CONCAT26(in_stack_fffffffffffff086,in_stack_fffffffffffff080));
      TPZFMatrix<long_double>::operator=
                ((TPZFMatrix<long_double> *)CONCAT62(in_stack_fffffffffffff022,uVar10),pTVar9);
      TPZFMatrix<long_double>::~TPZFMatrix((TPZFMatrix<long_double> *)0x12cedfd);
      TPZFMatrix<long_double>::~TPZFMatrix((TPZFMatrix<long_double> *)0x12cee0a);
      in_stack_fffffffffffff050 = (TPZFMatrix<long_double> *)0x0;
      plVar3 = TPZFMatrix<long_double>::operator()(&local_d0,0);
      in_stack_fffffffffffff058 = SUB108(*plVar3,0);
      uVar11 = (undefined2)((unkuint10)*plVar3 >> 0x40);
      in_stack_fffffffffffff070 = in_ST6;
      plVar3 = TPZFMatrix<long_double>::operator()(&local_160,(int64_t)in_stack_fffffffffffff050);
      *plVar3 = (longdouble)CONCAT28(uVar11,in_stack_fffffffffffff058);
      in_ST6 = lVar5;
      lVar4 = lVar6;
      Norm((TPZFMatrix<long_double> *)CONCAT62(in_stack_fffffffffffff022,uVar10));
      in_stack_fffffffffffff068 = (undefined6)((unkuint10)in_ST7 >> 0x20);
      local_40 = TPZExtractVal::val(in_ST7);
      if (local_40 / local_728 < *local_38) {
        *local_38 = local_40;
        *local_30 = local_7c8;
        local_4 = 0;
        goto LAB_012cf03e;
      }
      plVar3 = TPZFMatrix<long_double>::operator()(&local_320,0);
      uVar10 = (undefined2)((unkuint10)*plVar3 >> 0x40);
      lVar5 = lVar4;
      RVar7 = TPZExtractVal::val(*plVar3);
      if ((RVar7 == 0.0) && (!NAN(RVar7))) {
        Norm((TPZFMatrix<long_double> *)CONCAT62(in_stack_fffffffffffff022,uVar10));
        RVar7 = TPZExtractVal::val(in_ST2);
        *local_38 = RVar7 / local_728;
        local_4 = 3;
        goto LAB_012cf03e;
      }
      in_ST7 = lVar6;
    }
    *local_38 = local_40;
    local_4 = 1;
  }
  else {
    *local_38 = local_40;
    *local_30 = 0;
    local_4 = 0;
  }
LAB_012cf03e:
  TPZFMatrix<long_double>::~TPZFMatrix((TPZFMatrix<long_double> *)0x12cf04b);
  TPZFMatrix<long_double>::~TPZFMatrix((TPZFMatrix<long_double> *)0x12cf058);
  TPZFMatrix<long_double>::~TPZFMatrix((TPZFMatrix<long_double> *)0x12cf065);
  TPZFMatrix<long_double>::~TPZFMatrix((TPZFMatrix<long_double> *)0x12cf072);
  TPZFMatrix<long_double>::~TPZFMatrix((TPZFMatrix<long_double> *)0x12cf07f);
  TPZFMatrix<long_double>::~TPZFMatrix((TPZFMatrix<long_double> *)0x12cf08c);
  TPZFMatrix<long_double>::~TPZFMatrix((TPZFMatrix<long_double> *)0x12cf099);
  TPZFMatrix<long_double>::~TPZFMatrix((TPZFMatrix<long_double> *)0x12cf0a6);
  TPZFMatrix<long_double>::~TPZFMatrix((TPZFMatrix<long_double> *)0x12cf0b3);
  TPZFMatrix<long_double>::~TPZFMatrix((TPZFMatrix<long_double> *)0x12cf0c0);
  TPZFMatrix<long_double>::~TPZFMatrix((TPZFMatrix<long_double> *)0x12cf0cd);
  TPZFMatrix<long_double>::~TPZFMatrix((TPZFMatrix<long_double> *)0x12cf0da);
  TPZFMatrix<long_double>::~TPZFMatrix((TPZFMatrix<long_double> *)0x12cf0e7);
  return local_4;
}

Assistant:

int 
BiCGSTAB(const Matrix &A, Vector &x, const Vector &b,
         /*const */Preconditioner &M, int64_t &max_iter, Real &tol, Vector *residual,const int FromCurrent)
{
	Real resid;
	Vector rho_1(1), rho_2(1), alpha(1), beta(1), omega(1);
	Vector p, phat, s, shat, t, v;
	
	Vector resbackup;
	Vector *res = residual;
	if(!res) res = &resbackup;
	Vector &r = *res;
	
	Real normb = TPZExtractVal::val(Norm(b));
	if(FromCurrent) A.MultAdd(x,b,r,-1.,1.);
	else {
		x.Zero();
		r = b;
	}
	
	Vector rtilde = r;
	
	if (normb == 0.0)
		normb = 1;
	
	if ((resid = TPZExtractVal::val(Norm(r))) / normb < tol) {
		tol = resid;
		max_iter = 0;
		return 0;
	}
	
	for (int64_t i = 1; i <= max_iter; i++) {
		rho_1(0) = Dot(rtilde, r);
		if (TPZExtractVal::val(rho_1(0)) == ((Real)0.)) {
			tol = TPZExtractVal::val(Norm(r)) / normb;
			return 2;
		}
		if (i == 1)
			p = r;
		else {
			beta(0) = (rho_1(0)/rho_2(0)) * (alpha(0)/omega(0));
			p = r + beta(0) * (p - omega(0) * v);
		}
		
		M.Solve(p, phat);
		A.Multiply(phat, v);
		alpha(0) = rho_1(0) / Dot(rtilde, v);
		s = r - alpha(0) * v;
		if ((resid = TPZExtractVal::val(Norm(r))) / normb < tol) {
			x += alpha(0) * phat;
			tol = resid;
			return 0;
		}
		M.Solve(s, shat);
		A.Multiply(shat, t);
		omega = Dot(t,s) / Dot(t,t);
		x += alpha(0) * phat + omega(0) * shat;
		r = s - omega(0) * t;
		
		rho_2(0) = rho_1(0);
		if ((resid = TPZExtractVal::val(Norm(r))) / normb < tol) {
			tol = resid;
			max_iter = i;
			return 0;
		}
		if (TPZExtractVal::val(omega(0)) == ((Real)0.)) {
			tol = TPZExtractVal::val(Norm(r)) / normb;
			return 3;
		}
	}
	
	tol = resid;
	return 1;
}